

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.cc
# Opt level: O3

void __thiscall
AckThread::AddSession(AckThread *this,uint32_t session_id,string *dst_ip,uint16_t dst_port)

{
  _List_node_base *p_Var1;
  mapped_type *pmVar2;
  WaitAckSession w;
  uint32_t local_74;
  WaitAckSession local_70;
  
  local_74 = session_id;
  WaitAckSession::WaitAckSession(&local_70,session_id,dst_ip,dst_port);
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_AckThread::WaitAckSession>,_std::allocator<std::pair<const_unsigned_int,_AckThread::WaitAckSession>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_AckThread::WaitAckSession>,_std::allocator<std::pair<const_unsigned_int,_AckThread::WaitAckSession>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->_wait_ack_sessions,&local_74);
  pmVar2->session_id = local_70.session_id;
  std::__cxx11::string::_M_assign((string *)&pmVar2->dst_ip);
  pmVar2->dst_port = local_70.dst_port;
  if (pmVar2 != &local_70) {
    std::__cxx11::list<WaitAckPacket,std::allocator<WaitAckPacket>>::
    _M_assign_dispatch<std::_List_const_iterator<WaitAckPacket>>
              ((list<WaitAckPacket,std::allocator<WaitAckPacket>> *)&pmVar2->wait_ack_packets,
               local_70.wait_ack_packets.
               super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>._M_impl._M_node.
               super__List_node_base._M_next);
  }
  pmVar2->previous_ack_base_packet_number = local_70.previous_ack_base_packet_number;
  pmVar2->previous_ack_packet_number_mask = local_70.previous_ack_packet_number_mask;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  while (local_70.wait_ack_packets.super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>.
         _M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&local_70.wait_ack_packets) {
    p_Var1 = (local_70.wait_ack_packets.
              super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_70.wait_ack_packets.
                    super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x20);
    local_70.wait_ack_packets.super__List_base<WaitAckPacket,_std::allocator<WaitAckPacket>_>.
    _M_impl._M_node.super__List_node_base._M_next = p_Var1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.dst_ip._M_dataplus._M_p != &local_70.dst_ip.field_2) {
    operator_delete(local_70.dst_ip._M_dataplus._M_p,
                    local_70.dst_ip.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AckThread::AddSession(uint32_t session_id, std::string &dst_ip, uint16_t dst_port)
{
	WaitAckSession w(session_id, dst_ip, dst_port);
	dd::AutoLock lock(_lock);
	_wait_ack_sessions[session_id] = w;
}